

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::UnaryUpdate<duckdb::MinMaxState<float>,float,duckdb::MinOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  data_ptr_t pdVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  UnifiedVectorFormat idata;
  float local_a4;
  Vector *local_a0;
  ulong local_98;
  idx_t local_90;
  ulong local_88;
  data_ptr_t local_80;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar2 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      local_88 = count + 0x3f >> 6;
      local_98 = 0;
      uVar8 = 0;
      local_a0 = input;
      local_90 = count;
      do {
        puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar7 = uVar8 + 0x40;
          if (count <= uVar8 + 0x40) {
            uVar7 = count;
          }
LAB_0129fe4d:
          uVar9 = uVar8;
          if (uVar8 < uVar7) {
            do {
              local_78.sel._0_4_ = *(undefined4 *)(pdVar2 + uVar8 * 4);
              if (state[4] == '\0') {
                *(undefined4 *)state = local_78.sel._0_4_;
                state[4] = '\x01';
              }
              else {
                bVar5 = GreaterThan::Operation<float>((float *)state,(float *)&local_78);
                if (bVar5) {
                  *(undefined4 *)state = local_78.sel._0_4_;
                }
              }
              uVar8 = uVar8 + 1;
              uVar9 = uVar7;
            } while (uVar7 != uVar8);
          }
        }
        else {
          uVar3 = puVar1[local_98];
          uVar7 = uVar8 + 0x40;
          if (count <= uVar8 + 0x40) {
            uVar7 = count;
          }
          input = local_a0;
          if (uVar3 == 0xffffffffffffffff) goto LAB_0129fe4d;
          uVar9 = uVar7;
          if ((uVar3 != 0) && (count = local_90, uVar9 = uVar8, uVar8 < uVar7)) {
            pdVar6 = pdVar2 + uVar8 * 4;
            uVar10 = 0;
            local_80 = pdVar6;
            do {
              if ((uVar3 >> (uVar10 & 0x3f) & 1) != 0) {
                local_78.sel._0_4_ = *(undefined4 *)(pdVar6 + uVar10 * 4);
                if (state[4] == '\0') {
                  *(undefined4 *)state = local_78.sel._0_4_;
                  state[4] = '\x01';
                }
                else {
                  bVar5 = GreaterThan::Operation<float>((float *)state,(float *)&local_78);
                  pdVar6 = local_80;
                  if (bVar5) {
                    *(undefined4 *)state = local_78.sel._0_4_;
                  }
                }
              }
              uVar10 = uVar10 + 1;
              count = local_90;
              input = local_a0;
              uVar9 = uVar7;
            } while (uVar7 - uVar8 != uVar10);
          }
        }
        local_98 = local_98 + 1;
        uVar8 = uVar9;
      } while (local_98 != local_88);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      local_78.sel._0_4_ = *(undefined4 *)input->data;
      if (state[4] == '\0') {
        *(undefined4 *)state = local_78.sel._0_4_;
        state[4] = '\x01';
      }
      else {
        bVar5 = GreaterThan::Operation<float>((float *)state,(float *)&local_78);
        if (bVar5) {
          *(undefined4 *)state = local_78.sel._0_4_;
        }
      }
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        lVar4 = *(long *)CONCAT44(local_78.sel._4_4_,local_78.sel._0_4_);
        uVar8 = 0;
        do {
          uVar7 = uVar8;
          if (lVar4 != 0) {
            uVar7 = (ulong)*(uint *)(lVar4 + uVar8 * 4);
          }
          if (state[4] == '\0') {
            *(float *)state = *(float *)(local_78.data + uVar7 * 4);
            state[4] = '\x01';
          }
          else {
            local_a4 = *(float *)(local_78.data + uVar7 * 4);
            bVar5 = GreaterThan::Operation<float>((float *)state,&local_a4);
            if (bVar5) {
              *(float *)state = local_a4;
            }
          }
          uVar8 = uVar8 + 1;
        } while (count != uVar8);
      }
    }
    else if (count != 0) {
      lVar4 = *(long *)CONCAT44(local_78.sel._4_4_,local_78.sel._0_4_);
      uVar8 = 0;
      do {
        uVar7 = uVar8;
        if (lVar4 != 0) {
          uVar7 = (ulong)*(uint *)(lVar4 + uVar8 * 4);
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar7 >> 6]
             >> (uVar7 & 0x3f) & 1) != 0)) {
          if (state[4] == '\0') {
            *(float *)state = *(float *)(local_78.data + uVar7 * 4);
            state[4] = '\x01';
          }
          else {
            local_a4 = *(float *)(local_78.data + uVar7 * 4);
            bVar5 = GreaterThan::Operation<float>((float *)state,&local_a4);
            if (bVar5) {
              *(float *)state = local_a4;
            }
          }
        }
        uVar8 = uVar8 + 1;
      } while (count != uVar8);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}